

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InputFloat(char *label,float *v,float step,float step_fast,int decimal_precision,
                      ImGuiInputTextFlags flags)

{
  bool bVar1;
  uint in_EDX;
  undefined8 in_RSI;
  char *in_RDI;
  char format [16];
  char *in_stack_00000010;
  char local_38 [44];
  ImGuiInputTextFlags flags_00;
  
  flags_00 = (ImGuiInputTextFlags)((ulong)in_RSI >> 0x20);
  local_38[0] = '%';
  local_38[1] = 'f';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  if (-1 < (int)in_EDX) {
    ImFormatString(local_38,0x10,"%%.%df",(ulong)in_EDX);
  }
  bVar1 = InputFloat(in_stack_00000010,(float *)format._8_8_,(float)format._4_4_,(float)format._0_4_
                     ,in_RDI,flags_00);
  return bVar1;
}

Assistant:

bool ImGui::InputFloat(const char* label, float* v, float step, float step_fast, int decimal_precision, ImGuiInputTextFlags flags)
{
    char format[16] = "%f";
    if (decimal_precision >= 0)
        ImFormatString(format, IM_ARRAYSIZE(format), "%%.%df", decimal_precision);
    return InputFloat(label, v, step, step_fast, format, flags);
}